

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O2

wchar_t rd_artifacts(void)

{
  uint16_t uVar1;
  undefined8 in_RAX;
  char *message;
  wchar_t wVar2;
  ulong uVar3;
  undefined6 uStack_28;
  uint8_t tmp8u;
  uint16_t tmp16u;
  
  _uStack_28 = in_RAX;
  rd_u16b(&tmp16u);
  uVar1 = tmp16u;
  if (player->is_dead == true) {
    uVar1 = tmp16u - 0x28;
    _uStack_28 = CONCAT26(uVar1,uStack_28);
  }
  if (z_info->a_max < uVar1) {
    message = format("Too many (%u) artifacts!",(ulong)uVar1);
    note(message);
    wVar2 = L'\xffffffff';
  }
  else {
    wVar2 = L'\0';
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      rd_byte(&tmp8u);
      aup_info[uVar3].created = tmp8u != '\0';
      rd_byte(&tmp8u);
      aup_info[uVar3].seen = tmp8u != '\0';
      rd_byte(&tmp8u);
      aup_info[uVar3].everseen = tmp8u != '\0';
      rd_byte(&tmp8u);
      uVar1 = tmp16u;
    }
  }
  return wVar2;
}

Assistant:

int rd_artifacts(void)
{
	int i;
	uint16_t tmp16u;

	/* Load the Artifacts */
	rd_u16b(&tmp16u);
	if (player->is_dead) {
		/* No randarts loaded, so less artifacts to check */
		tmp16u -= ART_NUM_RANDOM;
	}
	if (tmp16u > z_info->a_max) {
		note(format("Too many (%u) artifacts!", tmp16u));
		return (-1);
	}

	/* Read the artifact flags */
	for (i = 0; i < tmp16u; i++) {
		uint8_t tmp8u;

		rd_byte(&tmp8u);
		aup_info[i].created = tmp8u ? true : false;
		rd_byte(&tmp8u);
		aup_info[i].seen = tmp8u ? true : false;
		rd_byte(&tmp8u);
		aup_info[i].everseen = tmp8u ? true : false;
		rd_byte(&tmp8u);
	}

	return 0;
}